

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O3

int __thiscall
lzham::lzham_lib_z_compress2
          (lzham *this,uchar *pDest,lzham_z_ulong *pDest_len,uchar *pSource,lzham_z_ulong source_len
          ,int level)

{
  int iVar1;
  int iVar2;
  lzham_z_stream local_88;
  
  local_88.data_type = 0;
  local_88._92_4_ = 0;
  local_88.adler = 0;
  local_88.zfree = (lzham_z_free_func)0x0;
  local_88.opaque = (void *)0x0;
  local_88.state = (lzham_z_internal_state *)0x0;
  local_88.zalloc = (lzham_z_alloc_func)0x0;
  local_88.total_out = 0;
  local_88.msg = (char *)0x0;
  local_88.total_in = 0;
  local_88.reserved = 0;
  iVar1 = -10000;
  if ((*(ulong *)pDest | (ulong)pSource) >> 0x20 == 0) {
    local_88._8_8_ = (ulong)pSource & 0xffffffff;
    local_88._32_8_ = *(ulong *)pDest & 0xffffffff;
    local_88.next_in = (uchar *)pDest_len;
    local_88.next_out = (uchar *)this;
    iVar1 = lzham_lib_z_deflateInit2(&local_88,(int)source_len,0xe,0xf,9,level);
    if (iVar1 == 0) {
      iVar2 = lzham_lib_z_deflate(&local_88,4);
      if (iVar2 == 1) {
        *(lzham_z_ulong *)pDest = local_88.total_out;
        iVar1 = 0;
        if (local_88.state != (lzham_z_internal_state *)0x0) {
          lzham_lib_compress_deinit(local_88.state);
        }
      }
      else {
        if (local_88.state != (lzham_z_internal_state *)0x0) {
          lzham_lib_compress_deinit(local_88.state);
        }
        iVar1 = -5;
        if (iVar2 != 0) {
          iVar1 = iVar2;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int lzham_lib_z_compress2(unsigned char *pDest, lzham_z_ulong *pDest_len, const unsigned char *pSource, lzham_z_ulong source_len, int level)
   {
      int status;
      lzham_z_stream stream;
      memset(&stream, 0, sizeof(stream));

      // In case lzham_z_ulong is 64-bits (argh I hate longs).
      if ((source_len | *pDest_len) > 0xFFFFFFFFU)
      {
         LZHAM_LOG_ERROR(6042);
         return LZHAM_Z_PARAM_ERROR;
      }

      stream.next_in = pSource;
      stream.avail_in = (uint)source_len;
      stream.next_out = pDest;
      stream.avail_out = (uint)*pDest_len;

      status = lzham_lib_z_deflateInit(&stream, level);
      if (status != LZHAM_Z_OK)
      {
         LZHAM_LOG_ERROR(6043);
         return status;
      }

      status = lzham_lib_z_deflate(&stream, LZHAM_Z_FINISH);
      if (status != LZHAM_Z_STREAM_END)
      {
         lzham_lib_z_deflateEnd(&stream);
         return (status == LZHAM_Z_OK) ? LZHAM_Z_BUF_ERROR : status;
      }

      *pDest_len = stream.total_out;
      return lzham_lib_z_deflateEnd(&stream);
   }